

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O1

void asm_callid(ASMState *as,IRIns *ir,IRCallID id)

{
  IRRef args [2];
  uint local_20;
  uint local_1c;
  
  local_20 = (uint)(ir->field_0).op1;
  local_1c = (uint)(ir->field_0).op2;
  asm_setupresult(as,ir,lj_ir_callinfo + id);
  asm_gencall(as,lj_ir_callinfo + id,&local_20);
  return;
}

Assistant:

static void asm_callid(ASMState *as, IRIns *ir, IRCallID id)
{
  const CCallInfo *ci = &lj_ir_callinfo[id];
  IRRef args[2];
  args[0] = ir->op1;
  args[1] = ir->op2;
  asm_setupresult(as, ir, ci);
  asm_gencall(as, ci, args);
}